

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O2

TestGroup * __thiscall xe::TestGroup::createGroup(TestGroup *this,char *name,char *description)

{
  TestGroup *this_00;
  
  this_00 = (TestGroup *)operator_new(0xa0);
  TestGroup(this_00,this,TESTNODETYPE_GROUP,name,description);
  return this_00;
}

Assistant:

TestGroup* TestGroup::createGroup (const char* name, const char* description)
{
	return new TestGroup(this, TESTNODETYPE_GROUP, name, description);
}